

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O1

sexp sexp_save_image(sexp ctx_in,char *filename)

{
  char *pcVar1;
  bool bVar2;
  FILE *__s;
  sexp psVar3;
  size_t sVar4;
  size_t __size;
  sexp_heap_conflict heap;
  char *__format;
  sexp_image_header_t header;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_54;
  size_t local_48;
  char *local_40;
  sexp local_38;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    __format = "Could not open image file for writing: %s";
    heap = (sexp_heap_conflict)0x0;
  }
  else {
    bVar2 = false;
    psVar3 = sexp_gc_heap_pack(ctx_in,0);
    heap = (sexp_heap_conflict)0x0;
    if (((ulong)psVar3 & 3) != 0 || psVar3 == (sexp)0x0) goto LAB_0011ece1;
    if (psVar3->tag != 0x24) {
      bVar2 = false;
      heap = (sexp_heap_conflict)0x0;
      goto LAB_0011ece1;
    }
    heap = (psVar3->value).context.heap;
    pcVar1 = heap->data;
    __size = heap->size - 0x20;
    local_60 = 0xa69626968630707;
    local_54 = 0x68752a6d672d7663;
    local_58 = 0x10001;
    local_48 = __size;
    local_40 = pcVar1 + 0x20;
    local_38 = psVar3;
    sVar4 = fwrite(&local_60,0x30,1,__s);
    __format = "Error writing image file: %s";
    if (sVar4 == 1) {
      sVar4 = fwrite(pcVar1 + 0x20,__size,1,__s);
      bVar2 = true;
      if (sVar4 == 1) goto LAB_0011ece1;
    }
  }
  bVar2 = false;
  snprintf(gc_heap_err_str,0x100,__format,filename);
LAB_0011ece1:
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  if (heap != (sexp_heap_conflict)0x0) {
    sexp_free_heap(heap);
  }
  if (!bVar2) {
    psVar3 = sexp_user_exception(ctx_in,(sexp)0x0,gc_heap_err_str,(sexp)&DAT_0000023e);
    return psVar3;
  }
  return (sexp)&DAT_0000013e;
}

Assistant:

sexp sexp_save_image (sexp ctx_in, const char* filename) {
  sexp_heap heap = NULL;
  sexp res = NULL;
  FILE *fp = fopen(filename, "wb");
  if (!fp) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Could not open image file for writing: %s", filename);
    goto done;
  }
  
  /* Save ONLY packed, active SEXPs.  No free list structures or padding. */
  sexp ctx_out = sexp_gc_heap_pack(ctx_in, 0);
  if (!ctx_out || !sexp_contextp(ctx_out)) {
    goto done;
  }
  heap = sexp_context_heap(ctx_out);
  sexp   base = sexp_heap_first_block(heap);
  size_t pad  = (size_t)((unsigned char *)base - (unsigned char *)heap->data);
  size_t size = heap->size - pad;
  
  struct sexp_image_header_t header;
  memcpy(&header.magic, SEXP_IMAGE_MAGIC, sizeof(header.magic));
  memcpy(&header.abi, SEXP_ABI_IDENTIFIER, sizeof(header.abi));
  header.major   = SEXP_IMAGE_MAJOR_VERSION;
  header.minor   = SEXP_IMAGE_MINOR_VERSION;
  header.size    = size;
  header.base    = base;
  header.context = ctx_out;

  if (! (fwrite(&header, sizeof(header), 1, fp) == 1 &&
         fwrite(base, size, 1, fp) == 1)) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Error writing image file: %s", filename);
    goto done;
  }
  
  res = SEXP_TRUE;
done:
  if (fp) fclose(fp);
  if (heap) sexp_free_heap(heap);
  if (res != SEXP_TRUE) res = sexp_user_exception(ctx_in, NULL, gc_heap_err_str, SEXP_NULL);
  return res;
}